

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O3

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  pointer puVar1;
  _Rb_tree_color _Var2;
  pointer pmVar3;
  pointer pmVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pdVar7;
  size_t *psVar8;
  _Rb_tree_node_base *p_Var9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  size_type __new_size;
  long lVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pmVar3 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = 0;
  lVar11 = (long)(A->
                 super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  if (lVar11 == 0) {
    __new_size = 0;
  }
  else {
    lVar11 = (lVar11 >> 4) * -0x5555555555555555;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    psVar8 = (size_t *)((long)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header + 0x20);
    __new_size = 0;
    do {
      __new_size = __new_size + *psVar8;
      psVar8 = psVar8 + 6;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(B_cols,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(B_values,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (B_rows,((long)(A->
                           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(A->
                           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                    1);
  pmVar3 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar4 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)pmVar4 - (long)pmVar3 >> 4;
  lVar11 = lVar14 * -0x5555555555555555;
  puVar5 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pmVar4 != pmVar3) {
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    lVar13 = 0;
    do {
      for (p_Var9 = pmVar3[lVar13]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &pmVar3[lVar13]._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        puVar5[p_Var9[1]._M_color] = puVar5[p_Var9[1]._M_color] + 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11);
    if (pmVar4 == pmVar3) {
      uVar12 = 0;
    }
    else {
      lVar13 = 0;
      uVar10 = 0;
      do {
        uVar12 = puVar5[lVar13] + uVar10;
        puVar5[lVar13] = uVar10;
        lVar13 = lVar13 + 1;
        uVar10 = uVar12;
      } while (lVar11 != lVar13);
    }
  }
  puVar5[lVar14 * -0x1555555555555555] = uVar12;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,B_rows);
  puVar5 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar3 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(A->
                 super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  if (lVar11 != 0) {
    lVar14 = (lVar11 >> 4) * -0x5555555555555555;
    puVar6 = (B_cols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (B_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      for (p_Var9 = *(_Base_ptr *)((long)&pmVar3[lVar11]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var9 != &pmVar3[lVar11]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        _Var2 = p_Var9[1]._M_color;
        uVar12 = puVar5[_Var2];
        puVar6[uVar12] = (uint)lVar11;
        pdVar7[uVar12] = (double)p_Var9[1]._M_parent;
        puVar1 = puVar5 + _Var2;
        *puVar1 = *puVar1 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar14 + (ulong)(lVar14 == 0));
  }
  do_nothing(B_rows,B_cols,B_values);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}